

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::RequiredExtensions
          (RequiredExtensions *this,char *ext)

{
  char *ext_local;
  RequiredExtensions *this_local;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->m_extensions);
  add(this,ext);
  return;
}

Assistant:

explicit					RequiredExtensions	(const char* ext)						{ add(ext);				}